

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_posix_formatting.cpp
# Opt level: O1

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
conv_to_char<wchar_t>
          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
           *__return_storage_ptr__,char *p)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  for (; *p != '\0'; p = p + 1) {
    std::__cxx11::wstring::push_back((wchar_t)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<CharType> conv_to_char(char const *p)
{
    std::basic_string<CharType> r;
    while(*p)
        r+=CharType(*p++);
    return r;
}